

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

string * __thiscall
tcu::FloatFormat::floatToHex_abi_cxx11_(string *__return_storage_ptr__,FloatFormat *this,double x)

{
  int iVar1;
  _func_int **pp_Var2;
  long lVar3;
  code cVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  size_type *psVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  bool *pbVar12;
  _func_int *p_Var13;
  int iVar14;
  double __x;
  ulong in_XMM0_Qb;
  int exp;
  ostringstream oss;
  int local_1bc;
  double local_1b8;
  ulong uStack_1b0;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  if (NAN(x)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "NaN";
    pcVar9 = "";
  }
  else {
    if (x < -1.79769313486232e+308 == x <= 1.79769313486232e+308) {
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inf","");
      pcVar9 = "+";
      if (x < 0.0) {
        pcVar9 = "-";
      }
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)pcVar9);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar8) {
        lVar3 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((_func_int **)local_1a8._0_8_ == local_198) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      return __return_storage_ptr__;
    }
    if ((x != 0.0) || (NAN(x))) {
      local_1bc = 0;
      local_1b8 = -x;
      uStack_1b0 = in_XMM0_Qb ^ 0x8000000000000000;
      __x = deFractExp((double)(~-(ulong)(local_1b8 <= x) & (ulong)local_1b8 |
                               -(ulong)(local_1b8 <= x) & (ulong)x),&local_1bc);
      iVar5 = this->m_minExp - local_1bc;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      iVar5 = this->m_fractionBits - iVar5;
      ldexp(__x,iVar5);
      iVar1 = this->m_fractionBits;
      iVar14 = local_1bc + iVar1;
      iVar10 = iVar1 + 6;
      if (-1 < iVar1 + 3) {
        iVar10 = iVar1 + 3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pbVar12 = glcts::fixed_sample_locations_values + 1;
      if (x < local_1b8) {
        pbVar12 = (bool *)0x1ac1c27;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pbVar12,(ulong)(x < local_1b8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      pp_Var2 = poVar7->_vptr_basic_ostream;
      *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
      *(long *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = (long)(iVar10 >> 2);
      p_Var13 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
      if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
        cVar4 = (code)std::ios::widen((char)p_Var13);
        p_Var13[0xe0] = cVar4;
        p_Var13[0xe1] = (code)0x1;
      }
      p_Var13[0xe0] = (code)0x30;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"p",1);
      pp_Var2 = poVar7->_vptr_basic_ostream;
      p_Var13 = pp_Var2[-3];
      *(uint *)(&poVar7->field_0x18 + (long)p_Var13) =
           *(uint *)(&poVar7->field_0x18 + (long)p_Var13) & 0xffffffb5 | 2;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 0;
      std::ostream::operator<<(poVar7,iVar14 - iVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "0.0";
    pcVar9 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar11,pcVar9);
  return __return_storage_ptr__;
}

Assistant:

std::string	FloatFormat::floatToHex	(double x) const
{
	if (deIsNaN(x))
		return "NaN";
	else if (deIsInf(x))
		return (x < 0.0 ? "-" : "+") + std::string("inf");
	else if (x == 0.0) // \todo [2014-03-27 lauri] Negative zero
		return "0.0";

	int					exp			= 0;
	const double		frac		= deFractExp(deAbs(x), &exp);
	const int			shift		= exponentShift(exp);
	const deUint64		bits		= deUint64(deLdExp(frac, shift));
	const deUint64		whole		= bits >> m_fractionBits;
	const deUint64		fraction	= bits & ((deUint64(1) << m_fractionBits) - 1);
	const int			exponent	= exp + m_fractionBits - shift;
	const int			numDigits	= (m_fractionBits + 3) / 4;
	const deUint64		aligned		= fraction << (numDigits * 4 - m_fractionBits);
	std::ostringstream	oss;

	oss << (x < 0 ? "-" : "")
		<< "0x" << whole << "."
		<< std::hex << std::setw(numDigits) << std::setfill('0') << aligned
		<< "p" << std::dec << std::setw(0) << exponent;

	return oss.str();
}